

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool __thiscall
el::base::RegisteredHitCounters::validateAfterN
          (RegisteredHitCounters *this,char *filename,LineNumber lineNumber,size_t n)

{
  size_t sVar1;
  unsigned_long in_RCX;
  char **in_RDX;
  RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate> *in_RSI;
  long *in_RDI;
  HitCounter *counter;
  ScopedLock scopedLock;
  NoMutex *in_stack_ffffffffffffff98;
  NoScopedLock<el::base::threading::internal::NoMutex> *in_stack_ffffffffffffffa0;
  HitCounter *local_38;
  NoScopedLock<el::base::threading::internal::NoMutex> local_30;
  bool local_1;
  
  (**(code **)(*in_RDI + 0x10))();
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::NoScopedLock
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_38 = utils::RegistryWithPred<el::base::HitCounter,el::base::HitCounter::Predicate>::
             get<char_const*,unsigned_long>(in_RSI,in_RDX,in_RCX);
  if (local_38 == (HitCounter *)0x0) {
    local_38 = (HitCounter *)operator_new(0x20);
    HitCounter::HitCounter(local_38,(char *)in_RSI,(LineNumber)in_RDX);
    (**(code **)(*in_RDI + 0x80))();
  }
  sVar1 = HitCounter::hitCounts(local_38);
  if (sVar1 < in_RCX) {
    HitCounter::increment(local_38);
  }
  local_1 = sVar1 >= in_RCX;
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::~NoScopedLock
            (&local_30);
  return local_1;
}

Assistant:

bool RegisteredHitCounters::validateAfterN(const char* filename, base::type::LineNumber lineNumber, std::size_t n) {
  base::threading::ScopedLock scopedLock(lock());
  base::HitCounter* counter = get(filename, lineNumber);
  if (counter == nullptr) {
    registerNew(counter = new base::HitCounter(filename, lineNumber));
  }
  // Do not use validateHitCounts here since we do not want to reset counter here
  // Note the >= instead of > because we are incrementing
  // after this check
  if (counter->hitCounts() >= n)
    return true;
  counter->increment();
  return false;
}